

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  undefined8 this_00;
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  Type *in_RDX;
  TransformPromiseNodeBase *local_2e8;
  ExceptionOrValue *local_2e0;
  Maybe<kj::Exception> local_2d8;
  undefined1 local_178 [8];
  NullableValue<kj::Exception> exception;
  ExceptionOrValue *output_local;
  TransformPromiseNodeBase *this_local;
  
  local_2e8 = this;
  local_2e0 = output;
  exception.field_1._336_8_ = output;
  runCatchingExceptions<kj::_::TransformPromiseNodeBase::get(kj::_::ExceptionOrValue&)::__0>
            (&local_2d8,(kj *)&local_2e8,in_RDX);
  other = readMaybe<kj::Exception>(&local_2d8);
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_178,other);
  Maybe<kj::Exception>::~Maybe(&local_2d8);
  pEVar1 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_178);
  this_00 = exception.field_1._336_8_;
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_178);
    pEVar1 = mv<kj::Exception>(pEVar1);
    ExceptionOrValue::addException((ExceptionOrValue *)this_00,pEVar1);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_178);
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(*exception));
  }
}